

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout_p.h
# Opt level: O0

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::operator=(QDockAreaLayoutInfo *this,QDockAreaLayoutInfo *param_2)

{
  undefined4 uVar1;
  QList<QDockAreaLayoutItem> *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  
  in_RDI->sep = (int *)(in_RSI->d).d;
  QList<QWidget_*>::operator=((QList<QWidget_*> *)in_RSI,(QList<QWidget_*> *)in_RDI);
  *(QDockAreaLayoutItem **)&in_RDI->dockPos = in_RSI[1].d.ptr;
  uVar1 = *(undefined4 *)((long)&in_RSI[1].d.size + 4);
  (in_RDI->rect).x1 = (Representation)*(undefined4 *)&in_RSI[1].d.size;
  (in_RDI->rect).y1 = (Representation)uVar1;
  *(Data **)&(in_RDI->rect).x2 = in_RSI[2].d.d;
  in_RDI->mainWindow = (QMainWindow *)in_RSI[2].d.ptr;
  QList<QDockAreaLayoutItem>::operator=(in_RSI,(QList<QDockAreaLayoutItem> *)in_RDI);
  *(qsizetype *)&in_RDI->tabbed = in_RSI[3].d.size;
  in_RDI->tabBar = (QTabBar *)in_RSI[4].d.d;
  in_RDI->tabBarShape = *(int *)&in_RSI[4].d.ptr;
  return in_RDI;
}

Assistant:

class Q_AUTOTEST_EXPORT QDockAreaLayoutInfo
{
public:
    QDockAreaLayoutInfo();
    QDockAreaLayoutInfo(const int *_sep, QInternal::DockPosition _dockPos, Qt::Orientation _o,
                        int tbhape, QMainWindow *window);

    QSize minimumSize() const;
    QSize maximumSize() const;
    QSize sizeHint() const;
    QSize size() const;

    bool insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem);
    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path);
    enum TabMode { NoTabs, AllowTabs, ForceTabs };
    QList<int> gapIndex(const QPoint &pos, bool nestingEnabled,
                            TabMode tabMode) const;
    void remove(const QList<int> &path);
    void remove(QWidget *widget);
    void unnest(int index);
    void split(int index, Qt::Orientation orientation, QLayoutItem *dockWidgetItem);
#if QT_CONFIG(tabbar)
    void tab(int index, QLayoutItem *dockWidgetItem);
#endif
    QDockAreaLayoutItem &item(const QList<int> &path);
    QDockAreaLayoutInfo *info(const QList<int> &path);
    QDockAreaLayoutInfo *info(QWidget *widget);

    enum { // sentinel values used to validate state data
        SequenceMarker = 0xfc,
        TabMarker = 0xfa,
        WidgetMarker = 0xfb
    };
    void saveState(QDataStream &stream) const;
    bool restoreState(QDataStream &stream, QList<QDockWidget*> &widgets, bool testing);

    void fitItems();
    bool expansive(Qt::Orientation o) const;
    int changeSize(int index, int size, bool below);
    QRect itemRect(int index, bool isGap = false) const;
    QRect itemRect(const QList<int> &path) const;
    QRect separatorRect(int index) const;
    QRect separatorRect(const QList<int> &path) const;

    void clear();
    bool isEmpty() const;
    bool hasGapItem(const QList<int> &path) const;
    bool onlyHasPlaceholders() const;
    bool hasFixedSize() const;
    QList<int> findSeparator(const QPoint &pos) const;
    int next(int idx) const;
    int prev(int idx) const;

    QList<int> indexOf(const QWidget *widget) const;
    QList<int> indexOfPlaceHolder(const QString &objectName) const;
    std::unique_ptr<QLayoutItem> takeWidgetItem(QWidget *widget);

    QDockWidget *apply(bool animate);

    void paintSeparators(QPainter *p, QWidget *widget, const QRegion &clip,
                            const QPoint &mouse) const;
    QRegion separatorRegion() const;
    int separatorMove(int index, int delta);
    int separatorMove(const QList<int> &separator, const QPoint &origin, const QPoint &dest);

    QLayoutItem *itemAt(int *x, int index) const;
    QLayoutItem *takeAt(int *x, int index);
    void add(QWidget *widget);
    void deleteAllLayoutItems();

    QMainWindowLayout *mainWindowLayout() const;

    const int *sep;
    mutable QList<QWidget *> separatorWidgets;
    QInternal::DockPosition dockPos;
    Qt::Orientation o;
    QRect rect;
    QMainWindow *mainWindow;
    QList<QDockAreaLayoutItem> item_list;
#if QT_CONFIG(tabbar)
    void updateSeparatorWidgets() const;
    QSet<QWidget*> usedSeparatorWidgets() const;

    quintptr currentTabId() const;
    void setCurrentTab(QWidget *widget);
    void setCurrentTabId(quintptr id);
    QRect tabContentRect() const;
    bool tabbed;
    QTabBar *tabBar;
    int tabBarShape;

    void reparentWidgets(QWidget *p);
    bool updateTabBar() const;
    void setTabBarShape(int shape);
    QSize tabBarMinimumSize() const;
    QSize tabBarSizeHint() const;

    QSet<QTabBar*> usedTabBars() const;

    int tabIndexToListIndex(int) const;
    void moveTab(int from, int to);
#endif // QT_CONFIG(tabbar)
}